

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.c
# Opt level: O0

int ossl_method_store_cache_set
              (OSSL_METHOD_STORE *store,OSSL_PROVIDER *prov,int nid,char *prop_query,void *method,
              _func_int_void_ptr *method_up_ref,_func_void_void_ptr *method_destruct)

{
  int iVar1;
  ALGORITHM *pAVar2;
  QUERY *pQVar3;
  size_t sVar4;
  ulong uVar5;
  char *in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  long in_stack_00000008;
  int res;
  size_t len;
  ALGORITHM *alg;
  QUERY *p;
  QUERY *old;
  QUERY elem;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  int iVar6;
  OSSL_METHOD_STORE *in_stack_ffffffffffffff80;
  long *local_78;
  
  local_78 = (long *)0x0;
  iVar6 = 1;
  if ((in_EDX < 1) || (in_RDI == 0)) {
    return 0;
  }
  if (in_RCX == (char *)0x0) {
    return 1;
  }
  if (in_RSI == 0) {
    return 0;
  }
  iVar1 = ossl_property_write_lock((OSSL_METHOD_STORE *)CONCAT44(1,in_stack_ffffffffffffff70));
  if (iVar1 == 0) {
    return 0;
  }
  if (*(int *)(in_RDI + 0x18) != 0) {
    ossl_method_cache_flush_some(in_stack_ffffffffffffff80);
  }
  pAVar2 = ossl_method_store_retrieve
                     ((OSSL_METHOD_STORE *)CONCAT44(iVar6,in_stack_ffffffffffffff70),
                      in_stack_ffffffffffffff6c);
  if (pAVar2 != (ALGORITHM *)0x0) {
    if (in_R8 == 0) {
      pQVar3 = lh_QUERY_delete((lhash_st_QUERY *)CONCAT44(iVar6,in_stack_ffffffffffffff70),
                               (QUERY *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68
                                                ));
      if (pQVar3 != (QUERY *)0x0) {
        impl_cache_free((QUERY *)0x2b077a);
        *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + -1;
      }
      goto LAB_002b08e6;
    }
    sVar4 = strlen(in_RCX);
    local_78 = (long *)CRYPTO_malloc((int)sVar4 + 0x30,"crypto/property/property.c",0x291);
    if (local_78 != (long *)0x0) {
      local_78[1] = (long)(local_78 + 5);
      *local_78 = in_RSI;
      local_78[2] = in_R8;
      local_78[3] = in_R9;
      local_78[4] = in_stack_00000008;
      iVar1 = ossl_method_up_ref((METHOD *)0x2b0828);
      if (iVar1 != 0) {
        memcpy((void *)local_78[1],in_RCX,sVar4 + 1);
        pQVar3 = lh_QUERY_insert((lhash_st_QUERY *)CONCAT44(iVar6,in_stack_ffffffffffffff70),
                                 (QUERY *)CONCAT44(in_stack_ffffffffffffff6c,
                                                   in_stack_ffffffffffffff68));
        if (pQVar3 != (QUERY *)0x0) {
          impl_cache_free((QUERY *)0x2b0876);
          goto LAB_002b08e6;
        }
        iVar1 = lh_QUERY_error((lhash_st_QUERY *)0x2b0886);
        if (iVar1 == 0) {
          uVar5 = *(long *)(in_RDI + 8) + 1;
          *(ulong *)(in_RDI + 8) = uVar5;
          if (499 < uVar5) {
            *(undefined4 *)(in_RDI + 0x18) = 1;
          }
          goto LAB_002b08e6;
        }
        ossl_method_free((METHOD *)0x2b08c6);
      }
    }
  }
  iVar6 = 0;
  CRYPTO_free(local_78);
LAB_002b08e6:
  ossl_property_unlock((OSSL_METHOD_STORE *)CONCAT44(iVar6,in_stack_ffffffffffffff70));
  return iVar6;
}

Assistant:

int ossl_method_store_cache_set(OSSL_METHOD_STORE *store, OSSL_PROVIDER *prov,
                                int nid, const char *prop_query, void *method,
                                int (*method_up_ref)(void *),
                                void (*method_destruct)(void *))
{
    QUERY elem, *old, *p = NULL;
    ALGORITHM *alg;
    size_t len;
    int res = 1;

    if (nid <= 0 || store == NULL)
        return 0;
    if (prop_query == NULL)
        return 1;

    if (!ossl_assert(prov != NULL))
        return 0;

    if (!ossl_property_write_lock(store))
        return 0;
    if (store->need_flush)
        ossl_method_cache_flush_some(store);
    alg = ossl_method_store_retrieve(store, nid);
    if (alg == NULL)
        goto err;

    if (method == NULL) {
        elem.query = prop_query;
        elem.provider = prov;
        if ((old = lh_QUERY_delete(alg->cache, &elem)) != NULL) {
            impl_cache_free(old);
            store->nelem--;
        }
        goto end;
    }
    p = OPENSSL_malloc(sizeof(*p) + (len = strlen(prop_query)));
    if (p != NULL) {
        p->query = p->body;
        p->provider = prov;
        p->method.method = method;
        p->method.up_ref = method_up_ref;
        p->method.free = method_destruct;
        if (!ossl_method_up_ref(&p->method))
            goto err;
        memcpy((char *)p->query, prop_query, len + 1);
        if ((old = lh_QUERY_insert(alg->cache, p)) != NULL) {
            impl_cache_free(old);
            goto end;
        }
        if (!lh_QUERY_error(alg->cache)) {
            if (++store->nelem >= IMPL_CACHE_FLUSH_THRESHOLD)
                store->need_flush = 1;
            goto end;
        }
        ossl_method_free(&p->method);
    }
err:
    res = 0;
    OPENSSL_free(p);
end:
    ossl_property_unlock(store);
    return res;
}